

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall VW::config::base_option::~base_option(base_option *this)

{
  base_option *in_RDI;
  
  ~base_option(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~base_option() {}